

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O3

void __thiscall
flatbuffers::swift::SwiftGenerator::GenTableReaderFields(SwiftGenerator *this,FieldDef *field)

{
  IdlNamer *this_00;
  Value *type_00;
  CodeWriter *pCVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  BaseType BVar5;
  EnumDef *pEVar6;
  mapped_type *pmVar7;
  size_t sVar8;
  long *plVar9;
  undefined8 *puVar10;
  long *plVar11;
  size_type *psVar12;
  undefined8 uVar13;
  char *pcVar14;
  char *pcVar15;
  _Alloc_hider _Var16;
  bool bVar17;
  string default_value;
  size_type __dnew_3;
  size_type __dnew_4;
  string is_required;
  size_type __dnew;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> required_reader;
  size_type __dnew_6;
  size_type __dnew_8;
  string def_Val;
  size_type __dnew_2;
  string optional;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> const_string;
  string type;
  string field_field;
  string offset;
  key_type local_3f8;
  string local_3d8;
  string local_3b8;
  CodeWriter *local_398;
  key_type local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  NumToString<unsigned_short>(&local_50,(field->value).offset);
  this_00 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(&local_70,this_00,field);
  type_00 = &field->value;
  GenType_abi_cxx11_(&local_90,this,&type_00->type,false);
  paVar2 = &local_3f8.field_2;
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"FIELDVAR","");
  (*(this_00->super_Namer)._vptr_Namer[7])(&local_2f0,this_00,field);
  pCVar1 = &this->code_;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&pCVar1->value_map_,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  paVar4 = &local_2f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != paVar4) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p,(ulong)(local_3f8.field_2._M_allocated_capacity + 1))
    ;
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"FIELDMETHOD","");
  (*(this_00->super_Namer)._vptr_Namer[4])(&local_2f0,this_00,field);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&pCVar1->value_map_,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != paVar4) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p,(ulong)(local_3f8.field_2._M_allocated_capacity + 1))
    ;
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"VALUETYPE","");
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&pCVar1->value_map_,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p,(ulong)(local_3f8.field_2._M_allocated_capacity + 1))
    ;
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"OFFSET","");
  (*(this->namer_).super_Namer._vptr_Namer[0x14])
            (&local_2f0,this_00,field,(ulong)(this->namer_).super_Namer.config_.constants);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&pCVar1->value_map_,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != paVar4) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p,(ulong)(local_3f8.field_2._M_allocated_capacity + 1))
    ;
  }
  local_3f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"CONSTANT","");
  SwiftConstant_abi_cxx11_(&local_2f0,this,field);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&pCVar1->value_map_,&local_3f8);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != paVar4) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p,(ulong)(local_3f8.field_2._M_allocated_capacity + 1))
    ;
  }
  if (field->presence == kOptional) {
    bVar17 = (type_00->type).base_type - BASE_TYPE_UTYPE < 0xc;
    pcVar14 = "{{CONSTANT}}";
    if (bVar17) {
      pcVar14 = "nil";
    }
    pcVar15 = "";
    if (bVar17) {
      pcVar15 = "?";
    }
  }
  else {
    pcVar14 = "{{CONSTANT}}";
    pcVar15 = "";
  }
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  local_398 = pCVar1;
  sVar8 = strlen(pcVar14);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,pcVar14,pcVar14 + sVar8);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  sVar8 = strlen(pcVar15);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,pcVar15,pcVar15 + sVar8);
  std::operator+(&local_3f8,"return o == 0 ? ",&local_2f0);
  paVar2 = &local_3f8.field_2;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_3f8);
  local_290 = &local_280;
  plVar11 = plVar9 + 2;
  if ((long *)*plVar9 == plVar11) {
    local_280 = *plVar11;
    lStack_278 = plVar9[3];
  }
  else {
    local_280 = *plVar11;
    local_290 = (long *)*plVar9;
  }
  local_288 = plVar9[1];
  *plVar9 = (long)plVar11;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f8._M_dataplus._M_p,(ulong)(local_3f8.field_2._M_allocated_capacity + 1))
    ;
  }
  GenComment(this,&(field->super_Definition).doc_comment);
  pCVar1 = local_398;
  BVar5 = (type_00->type).base_type;
  if (BVar5 - BASE_TYPE_UTYPE < 0xc) {
    if ((BVar5 - BASE_TYPE_UTYPE < 10) && ((field->value).type.enum_def != (EnumDef *)0x0)) {
      if (BVar5 == BASE_TYPE_BOOL) goto LAB_002e6e0c;
      if (field->presence == kOptional) {
        local_3f8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"nil","");
      }
      else {
        GenEnumDefaultValue_abi_cxx11_(&local_3f8,this,field);
      }
      paVar2 = &local_390.field_2;
      local_390._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"BASEVALUE","");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,GenTypeBasic::swift_type[(int)(type_00->type).base_type],
                 (allocator<char> *)&local_3d8);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&pCVar1->value_map_,&local_390);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,
                        (ulong)(local_350.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != paVar2) {
        operator_delete(local_390._M_dataplus._M_p,
                        (ulong)(local_390.field_2._M_allocated_capacity + 1));
      }
      GenReaderMainBody(&local_390,this,&local_2b0);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_390);
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_170.field_2._M_allocated_capacity = *psVar12;
        local_170.field_2._8_8_ = plVar9[3];
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      }
      else {
        local_170.field_2._M_allocated_capacity = *psVar12;
        local_170._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_170._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(pCVar1,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != paVar2) {
        operator_delete(local_390._M_dataplus._M_p,
                        (ulong)(local_390.field_2._M_allocated_capacity + 1));
      }
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      local_2d0._M_dataplus._M_p = (pointer)0x39;
      local_310._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_310,(ulong)&local_2d0);
      local_310.field_2._M_allocated_capacity = (size_type)local_2d0._M_dataplus._M_p;
      builtin_strncpy((char *)((long)local_310._M_dataplus._M_p + 0x29),".{{OFFSE",8);
      builtin_strncpy((char *)((long)local_310._M_dataplus._M_p + 0x31),"T}}.v); ",8);
      *(undefined8 *)((long)local_310._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
      *(undefined8 *)((long)local_310._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
      *(undefined8 *)((long)local_310._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
      *(undefined8 *)((long)local_310._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
      *(undefined8 *)local_310._M_dataplus._M_p = 0x203d206f2074656c;
      *(undefined8 *)((long)local_310._M_dataplus._M_p + 8) = 0x5353454343417b7b;
      local_310._M_string_length = (size_type)local_2d0._M_dataplus._M_p;
      local_310._M_dataplus._M_p[(long)local_2d0._M_dataplus._M_p] = '\0';
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
      pcVar14 = (char *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_330.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_330.field_2._8_8_ = puVar10[3];
      }
      else {
        local_330.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_330._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_330._M_string_length = puVar10[1];
      *puVar10 = pcVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_330,(ulong)local_3f8._M_dataplus._M_p);
      pcVar14 = (char *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_370.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_370.field_2._8_8_ = puVar10[3];
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      }
      else {
        local_370.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_370._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_370._M_string_length = puVar10[1];
      *puVar10 = pcVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
      paVar4 = &local_3b8.field_2;
      pcVar14 = (char *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_3b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3b8.field_2._8_8_ = puVar10[3];
        local_3b8._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_3b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3b8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3b8._M_string_length = puVar10[1];
      *puVar10 = pcVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"o","");
      GenEnumConstructor(&local_2d0,this,&local_270);
      uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != paVar4) {
        uVar13 = local_3b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < (char *)(local_3b8._M_string_length + local_2d0._M_string_length)) {
        uVar13 = (char *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          uVar13 = local_2d0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < (char *)(local_3b8._M_string_length + local_2d0._M_string_length))
        goto LAB_002e7e3c;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_2d0,0,(char *)0x0,(ulong)local_3b8._M_dataplus._M_p);
      }
      else {
LAB_002e7e3c:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3b8,(ulong)local_2d0._M_dataplus._M_p);
      }
      local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
      pcVar14 = (char *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3d8.field_2._8_8_ = puVar10[3];
      }
      else {
        local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3d8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3d8._M_string_length = puVar10[1];
      *puVar10 = pcVar14;
      puVar10[1] = 0;
      *pcVar14 = '\0';
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_3d8);
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      pcVar14 = (char *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_350.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_350.field_2._8_8_ = puVar10[3];
      }
      else {
        local_350.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_350._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_350._M_string_length = puVar10[1];
      *puVar10 = pcVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_350,(ulong)local_3f8._M_dataplus._M_p);
      pcVar14 = (char *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_390.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_390.field_2._8_8_ = puVar10[3];
        local_390._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_390.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_390._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_390._M_string_length = puVar10[1];
      *puVar10 = pcVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_390);
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_190.field_2._M_allocated_capacity = *psVar12;
        local_190.field_2._8_8_ = plVar9[3];
        local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      }
      else {
        local_190.field_2._M_allocated_capacity = *psVar12;
        local_190._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_190._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(local_398,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != paVar2) {
        operator_delete(local_390._M_dataplus._M_p,
                        (ulong)(local_390.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,
                        (ulong)(local_350.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p,
                        (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
        operator_delete(local_2d0._M_dataplus._M_p,
                        (ulong)(local_2d0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != paVar4) {
        operator_delete(local_3b8._M_dataplus._M_p,
                        (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,
                        (ulong)(local_370.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,
                        (ulong)(local_330.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,
                        (ulong)(local_310.field_2._M_allocated_capacity + 1));
      }
      if (((((this->super_BaseGenerator).parser_)->opts).mutable_buffer == true) &&
         ((pEVar6 = (field->value).type.enum_def, pEVar6 == (EnumDef *)0x0 ||
          (pEVar6->is_union == false)))) {
        local_390._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"o","");
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        local_3d8._M_dataplus._M_p = (pointer)0x39;
        local_350._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_350,(ulong)&local_3d8);
        local_350.field_2._M_allocated_capacity = (size_type)local_3d8._M_dataplus._M_p;
        builtin_strncpy((char *)((long)local_350._M_dataplus._M_p + 0x29),".{{OFFSE",8);
        builtin_strncpy((char *)((long)local_350._M_dataplus._M_p + 0x31),"T}}.v); ",8);
        *(undefined8 *)((long)local_350._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
        *(undefined8 *)((long)local_350._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
        *(undefined8 *)((long)local_350._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
        *(undefined8 *)((long)local_350._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
        *(undefined8 *)local_350._M_dataplus._M_p = 0x203d206f2074656c;
        *(undefined8 *)((long)local_350._M_dataplus._M_p + 8) = 0x5353454343417b7b;
        local_350._M_string_length = (size_type)local_3d8._M_dataplus._M_p;
        local_350._M_dataplus._M_p[(long)local_3d8._M_dataplus._M_p] = '\0';
        GenMutate(&local_f0,this,&local_390,&local_350,true);
        CodeWriter::operator+=(local_398,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
LAB_002e798d:
          operator_delete(local_350._M_dataplus._M_p,
                          (ulong)(local_350.field_2._M_allocated_capacity + 1));
        }
LAB_002e799d:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != &local_390.field_2) {
          operator_delete(local_390._M_dataplus._M_p,
                          (ulong)(local_390.field_2._M_allocated_capacity + 1));
        }
      }
    }
    else {
      if (BVar5 != BASE_TYPE_BOOL) {
        GenReaderMainBody(&local_3d8,this,&local_2b0);
        paVar2 = &local_3b8.field_2;
        local_370._M_dataplus._M_p = (pointer)0x39;
        local_3b8._M_dataplus._M_p = (pointer)paVar2;
        local_3b8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_3b8,(ulong)&local_370);
        local_3b8.field_2._M_allocated_capacity = (size_type)local_370._M_dataplus._M_p;
        builtin_strncpy((char *)((long)local_3b8._M_dataplus._M_p + 0x29),".{{OFFSE",8);
        builtin_strncpy((char *)((long)local_3b8._M_dataplus._M_p + 0x31),"T}}.v); ",8);
        *(undefined8 *)((long)local_3b8._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
        *(undefined8 *)((long)local_3b8._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
        *(undefined8 *)((long)local_3b8._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
        *(undefined8 *)((long)local_3b8._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
        *(undefined8 *)local_3b8._M_dataplus._M_p = 0x203d206f2074656c;
        *(undefined8 *)((long)local_3b8._M_dataplus._M_p + 8) = 0x5353454343417b7b;
        local_3b8._M_string_length = (size_type)local_370._M_dataplus._M_p;
        local_3b8._M_dataplus._M_p[(long)local_370._M_dataplus._M_p] = '\0';
        uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          uVar13 = local_3d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_370._M_dataplus._M_p + local_3d8._M_string_length) {
          _Var16._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8._M_dataplus._M_p != paVar2) {
            _Var16._M_p = local_370._M_dataplus._M_p;
          }
          if (_Var16._M_p < local_370._M_dataplus._M_p + local_3d8._M_string_length)
          goto LAB_002e6f52;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_3b8,0,(char *)0x0,(ulong)local_3d8._M_dataplus._M_p);
        }
        else {
LAB_002e6f52:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_3d8,(ulong)local_3b8._M_dataplus._M_p);
        }
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        pcVar14 = (char *)(puVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar14) {
          local_350.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
          local_350.field_2._8_8_ = puVar10[3];
        }
        else {
          local_350.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
          local_350._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_350._M_string_length = puVar10[1];
        *puVar10 = pcVar14;
        puVar10[1] = 0;
        *pcVar14 = '\0';
        puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_350,(ulong)local_290)
        ;
        paVar4 = &local_390.field_2;
        pcVar14 = (char *)(puVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar14) {
          local_390.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
          local_390.field_2._8_8_ = puVar10[3];
          local_390._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_390.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
          local_390._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_390._M_string_length = puVar10[1];
        *puVar10 = pcVar14;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"VALUETYPE","");
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"o","");
        GenReader(&local_370,this,&local_330,&local_310);
        uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != paVar4) {
          uVar13 = local_390.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < (char *)(local_370._M_string_length + local_390._M_string_length)) {
          uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_370._M_dataplus._M_p != &local_370.field_2) {
            uVar13 = local_370.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < (char *)(local_370._M_string_length + local_390._M_string_length))
          goto LAB_002e838c;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_370,0,(char *)0x0,(ulong)local_390._M_dataplus._M_p);
        }
        else {
LAB_002e838c:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_390,(ulong)local_370._M_dataplus._M_p);
        }
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        pcVar14 = (char *)(puVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar14) {
          local_3f8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
          local_3f8.field_2._8_8_ = puVar10[3];
        }
        else {
          local_3f8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
          local_3f8._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_3f8._M_string_length = puVar10[1];
        *puVar10 = pcVar14;
        puVar10[1] = 0;
        *pcVar14 = '\0';
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_3f8);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_110.field_2._M_allocated_capacity = *psVar12;
          local_110.field_2._8_8_ = plVar9[3];
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        }
        else {
          local_110.field_2._M_allocated_capacity = *psVar12;
          local_110._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_110._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        CodeWriter::operator+=(local_398,&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,
                          (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          operator_delete(local_370._M_dataplus._M_p,
                          (ulong)(local_370.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,
                          (ulong)(local_310.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          operator_delete(local_330._M_dataplus._M_p,
                          (ulong)(local_330.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != paVar4) {
          operator_delete(local_390._M_dataplus._M_p,
                          (ulong)(local_390.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p,
                          (ulong)(local_350.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != paVar2) {
          operator_delete(local_3b8._M_dataplus._M_p,
                          (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          operator_delete(local_3d8._M_dataplus._M_p,
                          (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
        }
        if ((((this->super_BaseGenerator).parser_)->opts).mutable_buffer != true) goto LAB_002e9a76;
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"o","");
        local_350._M_dataplus._M_p = (pointer)0x39;
        local_390._M_dataplus._M_p = (pointer)paVar4;
        local_390._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_390,(ulong)&local_350);
        local_390.field_2._M_allocated_capacity = (size_type)local_350._M_dataplus._M_p;
        builtin_strncpy((char *)((long)local_390._M_dataplus._M_p + 0x29),".{{OFFSE",8);
        builtin_strncpy((char *)((long)local_390._M_dataplus._M_p + 0x31),"T}}.v); ",8);
        *(undefined8 *)((long)local_390._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
        *(undefined8 *)((long)local_390._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
        *(undefined8 *)((long)local_390._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
        *(undefined8 *)((long)local_390._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
        *(undefined8 *)local_390._M_dataplus._M_p = 0x203d206f2074656c;
        *(undefined8 *)((long)local_390._M_dataplus._M_p + 8) = 0x5353454343417b7b;
        local_390._M_string_length = (size_type)local_350._M_dataplus._M_p;
        local_390._M_dataplus._M_p[(long)local_350._M_dataplus._M_p] = '\0';
        GenMutate(&local_b0,this,&local_3f8,&local_390,false);
        CodeWriter::operator+=(local_398,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_390._M_dataplus._M_p != paVar4) {
          operator_delete(local_390._M_dataplus._M_p,
                          (ulong)(local_390.field_2._M_allocated_capacity + 1));
        }
        uVar13 = local_3f8.field_2._M_allocated_capacity;
        _Var16._M_p = local_3f8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p == &local_3f8.field_2) goto LAB_002e9a76;
        goto LAB_002e9a6e;
      }
LAB_002e6e0c:
      if (field->presence == kOptional) {
        local_3f8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"nil","");
      }
      else {
        SwiftConstant_abi_cxx11_(&local_3f8,this,field);
      }
      paVar2 = &local_390.field_2;
      local_390._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"CONSTANT","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&pCVar1->value_map_,&local_390);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != paVar2) {
        operator_delete(local_390._M_dataplus._M_p,
                        (ulong)(local_390.field_2._M_allocated_capacity + 1));
      }
      local_390._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"VALUETYPE","");
      paVar4 = &local_350.field_2;
      local_350._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"Bool","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&pCVar1->value_map_,&local_390);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != paVar4) {
        operator_delete(local_350._M_dataplus._M_p,
                        (ulong)(local_350.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != paVar2) {
        operator_delete(local_390._M_dataplus._M_p,
                        (ulong)(local_390.field_2._M_allocated_capacity + 1));
      }
      GenReaderMainBody(&local_390,this,&local_2b0);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_390);
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_130.field_2._M_allocated_capacity = *psVar12;
        local_130.field_2._8_8_ = plVar9[3];
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      }
      else {
        local_130.field_2._M_allocated_capacity = *psVar12;
        local_130._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_130._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(pCVar1,&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != paVar2) {
        operator_delete(local_390._M_dataplus._M_p,
                        (ulong)(local_390.field_2._M_allocated_capacity + 1));
      }
      local_3b8._M_dataplus._M_p = (pointer)0x39;
      local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
      local_3d8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_3d8,(ulong)&local_3b8);
      local_3d8.field_2._M_allocated_capacity = (size_type)local_3b8._M_dataplus._M_p;
      builtin_strncpy((char *)((long)local_3d8._M_dataplus._M_p + 0x29),".{{OFFSE",8);
      builtin_strncpy((char *)((long)local_3d8._M_dataplus._M_p + 0x31),"T}}.v); ",8);
      *(undefined8 *)((long)local_3d8._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
      *(undefined8 *)((long)local_3d8._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
      *(undefined8 *)((long)local_3d8._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
      *(undefined8 *)((long)local_3d8._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
      *(undefined8 *)local_3d8._M_dataplus._M_p = 0x203d206f2074656c;
      *(undefined8 *)((long)local_3d8._M_dataplus._M_p + 8) = 0x5353454343417b7b;
      local_3d8._M_string_length = (size_type)local_3b8._M_dataplus._M_p;
      local_3d8._M_dataplus._M_p[(long)local_3b8._M_dataplus._M_p] = '\0';
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_3d8);
      pcVar14 = (char *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_350.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_350.field_2._8_8_ = puVar10[3];
        local_350._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_350.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_350._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_350._M_string_length = puVar10[1];
      *puVar10 = pcVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"VALUETYPE","");
      local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"o","");
      GenReader(&local_3b8,this,&local_370,&local_330);
      uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != paVar4) {
        uVar13 = local_350.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < (char *)(local_3b8._M_string_length + local_350._M_string_length)) {
        uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
          uVar13 = local_3b8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < (char *)(local_3b8._M_string_length + local_350._M_string_length))
        goto LAB_002e75e8;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_3b8,0,(char *)0x0,(ulong)local_350._M_dataplus._M_p);
      }
      else {
LAB_002e75e8:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_350,(ulong)local_3b8._M_dataplus._M_p);
      }
      pcVar14 = (char *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_390.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_390.field_2._8_8_ = puVar10[3];
        local_390._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_390.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_390._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_390._M_string_length = puVar10[1];
      *puVar10 = pcVar14;
      puVar10[1] = 0;
      *pcVar14 = '\0';
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_390);
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_150.field_2._M_allocated_capacity = *psVar12;
        local_150.field_2._8_8_ = plVar9[3];
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      }
      else {
        local_150.field_2._M_allocated_capacity = *psVar12;
        local_150._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_150._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(local_398,&local_150);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != paVar2) {
        operator_delete(local_390._M_dataplus._M_p,
                        (ulong)(local_390.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
        operator_delete(local_3b8._M_dataplus._M_p,
                        (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,
                        (ulong)(local_330.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,
                        (ulong)(local_370.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != paVar4) {
        operator_delete(local_350._M_dataplus._M_p,
                        (ulong)(local_350.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
        operator_delete(local_3d8._M_dataplus._M_p,
                        (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
      }
      if ((((this->super_BaseGenerator).parser_)->opts).mutable_buffer == true) {
        local_390._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"o","");
        local_3d8._M_dataplus._M_p = (pointer)0x39;
        local_350._M_dataplus._M_p = (pointer)paVar4;
        local_350._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_350,(ulong)&local_3d8);
        local_350.field_2._M_allocated_capacity = (size_type)local_3d8._M_dataplus._M_p;
        builtin_strncpy((char *)((long)local_350._M_dataplus._M_p + 0x29),".{{OFFSE",8);
        builtin_strncpy((char *)((long)local_350._M_dataplus._M_p + 0x31),"T}}.v); ",8);
        *(undefined8 *)((long)local_350._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
        *(undefined8 *)((long)local_350._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
        *(undefined8 *)((long)local_350._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
        *(undefined8 *)((long)local_350._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
        *(undefined8 *)local_350._M_dataplus._M_p = 0x203d206f2074656c;
        *(undefined8 *)((long)local_350._M_dataplus._M_p + 8) = 0x5353454343417b7b;
        local_350._M_string_length = (size_type)local_3d8._M_dataplus._M_p;
        local_350._M_dataplus._M_p[(long)local_3d8._M_dataplus._M_p] = '\0';
        GenMutate(&local_d0,this,&local_390,&local_350,false);
        CodeWriter::operator+=(local_398,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != paVar4) goto LAB_002e798d;
        goto LAB_002e799d;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p,
                      (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
    }
  }
  else {
    bVar17 = field->presence == kRequired;
    pcVar14 = "?";
    if (bVar17) {
      pcVar14 = "!";
    }
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    pcVar15 = "";
    if (bVar17) {
      pcVar15 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,pcVar14,pcVar15);
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    if (field->presence == kRequired) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"return ","");
    }
    else {
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_350,local_290,local_288 + (long)local_290);
    }
    switch((type_00->type).base_type) {
    case BASE_TYPE_STRING:
      SwiftConstant_abi_cxx11_(&local_3b8,this,field);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_3b8,0,(char *)0x0,0x36b964);
      paVar4 = &local_3d8.field_2;
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_3d8.field_2._M_allocated_capacity = *psVar12;
        local_3d8.field_2._8_8_ = plVar9[3];
        local_3d8._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_3d8.field_2._M_allocated_capacity = *psVar12;
        local_3d8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_3d8._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_3d8);
      pcVar14 = (char *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_3f8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3f8.field_2._8_8_ = puVar10[3];
        local_3f8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_3f8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3f8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3f8._M_string_length = puVar10[1];
      *puVar10 = pcVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != paVar4) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
      }
      paVar2 = &local_3b8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_3b8._M_dataplus._M_p,
                        (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
      }
      local_3d8._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"VALUETYPE","");
      GenType_abi_cxx11_(&local_3b8,this,&type_00->type,false);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&local_398->value_map_,&local_3d8);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_3b8._M_dataplus._M_p,
                        (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != paVar4) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
      }
      local_3d8._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"CONSTANT","");
      local_3b8._M_dataplus._M_p = (pointer)paVar2;
      if (field->presence == kDefault) {
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3b8,local_3f8._M_dataplus._M_p,
                   local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"nil","");
      }
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&local_398->value_map_,&local_3d8);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_3b8._M_dataplus._M_p,
                        (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != paVar4) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
      }
      GenReaderMainBody(&local_370,this,&local_390);
      paVar3 = &local_330.field_2;
      local_310._M_dataplus._M_p = (pointer)0x39;
      local_330._M_dataplus._M_p = (pointer)paVar3;
      local_330._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_330,(ulong)&local_310);
      local_330.field_2._M_allocated_capacity = (size_type)local_310._M_dataplus._M_p;
      builtin_strncpy((char *)((long)local_330._M_dataplus._M_p + 0x29),".{{OFFSE",8);
      builtin_strncpy((char *)((long)local_330._M_dataplus._M_p + 0x31),"T}}.v); ",8);
      *(undefined8 *)((long)local_330._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
      *(undefined8 *)((long)local_330._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
      *(undefined8 *)((long)local_330._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
      *(undefined8 *)((long)local_330._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
      *(undefined8 *)local_330._M_dataplus._M_p = 0x203d206f2074656c;
      *(undefined8 *)((long)local_330._M_dataplus._M_p + 8) = 0x5353454343417b7b;
      local_330._M_string_length = (size_type)local_310._M_dataplus._M_p;
      local_330._M_dataplus._M_p[(long)local_310._M_dataplus._M_p] = '\0';
      uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        uVar13 = local_370.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_310._M_dataplus._M_p + local_370._M_string_length) {
        _Var16._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != paVar3) {
          _Var16._M_p = local_310._M_dataplus._M_p;
        }
        if (_Var16._M_p < local_310._M_dataplus._M_p + local_370._M_string_length)
        goto LAB_002e80f3;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_330,0,(char *)0x0,(ulong)local_370._M_dataplus._M_p);
      }
      else {
LAB_002e80f3:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_370,(ulong)local_330._M_dataplus._M_p);
      }
      pcVar14 = (char *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_3b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3b8.field_2._8_8_ = puVar10[3];
        local_3b8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_3b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3b8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3b8._M_string_length = puVar10[1];
      *puVar10 = pcVar14;
      puVar10[1] = 0;
      *pcVar14 = '\0';
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_3b8,(ulong)local_350._M_dataplus._M_p);
      pcVar14 = (char *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3d8.field_2._8_8_ = puVar10[3];
        local_3d8._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3d8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3d8._M_string_length = puVar10[1];
      *puVar10 = pcVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3d8);
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_1d0.field_2._M_allocated_capacity = *psVar12;
        local_1d0.field_2._8_8_ = plVar9[3];
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      }
      else {
        local_1d0.field_2._M_allocated_capacity = *psVar12;
        local_1d0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_1d0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(local_398,&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != paVar4) {
        operator_delete(local_3d8._M_dataplus._M_p,
                        (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_3b8._M_dataplus._M_p,
                        (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != paVar3) {
        operator_delete(local_330._M_dataplus._M_p,
                        (ulong)(local_330.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,
                        (ulong)(local_370.field_2._M_allocated_capacity + 1));
      }
      std::operator+(&local_3d8,"{{ACCESS_TYPE}} var {{FIELDVAR}}SegmentArray: [UInt8]",&local_390);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3d8);
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_1f0.field_2._M_allocated_capacity = *psVar12;
        local_1f0.field_2._8_8_ = plVar9[3];
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      }
      else {
        local_1f0.field_2._M_allocated_capacity = *psVar12;
        local_1f0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_1f0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(local_398,&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != paVar4) {
        operator_delete(local_3d8._M_dataplus._M_p,
                        (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
      }
      uVar13 = local_3f8.field_2._M_allocated_capacity;
      _Var16._M_p = local_3f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
LAB_002e9782:
        operator_delete(_Var16._M_p,(ulong)(uVar13 + 1));
      }
      break;
    case BASE_TYPE_VECTOR:
    case BASE_TYPE_ARRAY:
      GenTableReaderVectorFields(this,field);
      break;
    case BASE_TYPE_STRUCT:
      if (((field->value).type.struct_def)->fixed != true) {
        local_3f8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"VALUETYPE","");
        GenType_abi_cxx11_(&local_3d8,this,&type_00->type,false);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_398->value_map_,&local_3f8);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        paVar4 = &local_3d8.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != paVar4) {
          operator_delete(local_3d8._M_dataplus._M_p,
                          (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar2) {
          operator_delete(local_3f8._M_dataplus._M_p,
                          (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
        }
        local_3f8._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"CONSTANT","");
        local_3d8._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"nil","");
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_398->value_map_,&local_3f8);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != paVar4) {
          operator_delete(local_3d8._M_dataplus._M_p,
                          (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != paVar2) {
          operator_delete(local_3f8._M_dataplus._M_p,
                          (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
        }
        GenReaderMainBody(&local_370,this,&local_390);
        paVar2 = &local_330.field_2;
        local_3f8._M_dataplus._M_p = (pointer)0x39;
        local_330._M_dataplus._M_p = (pointer)paVar2;
        local_330._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_330,(ulong)&local_3f8);
        local_330.field_2._M_allocated_capacity = (size_type)local_3f8._M_dataplus._M_p;
        builtin_strncpy((char *)((long)local_330._M_dataplus._M_p + 0x29),".{{OFFSE",8);
        builtin_strncpy((char *)((long)local_330._M_dataplus._M_p + 0x31),"T}}.v); ",8);
        *(undefined8 *)((long)local_330._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
        *(undefined8 *)((long)local_330._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
        *(undefined8 *)((long)local_330._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
        *(undefined8 *)((long)local_330._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
        *(undefined8 *)local_330._M_dataplus._M_p = 0x203d206f2074656c;
        *(undefined8 *)((long)local_330._M_dataplus._M_p + 8) = 0x5353454343417b7b;
        local_330._M_string_length = (size_type)local_3f8._M_dataplus._M_p;
        local_330._M_dataplus._M_p[(long)local_3f8._M_dataplus._M_p] = '\0';
        uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          uVar13 = local_370.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_3f8._M_dataplus._M_p + local_370._M_string_length) {
          _Var16._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                  *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330._M_dataplus._M_p != paVar2) {
            _Var16._M_p = local_3f8._M_dataplus._M_p;
          }
          if (_Var16._M_p < local_3f8._M_dataplus._M_p + local_370._M_string_length)
          goto LAB_002e7b9d;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_330,0,(char *)0x0,(ulong)local_370._M_dataplus._M_p);
        }
        else {
LAB_002e7b9d:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_370,(ulong)local_330._M_dataplus._M_p);
        }
        local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
        pcVar14 = (char *)(puVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar14) {
          local_3b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
          local_3b8.field_2._8_8_ = puVar10[3];
        }
        else {
          local_3b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
          local_3b8._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_3b8._M_string_length = puVar10[1];
        *puVar10 = pcVar14;
        puVar10[1] = 0;
        *pcVar14 = '\0';
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3b8,(ulong)local_350._M_dataplus._M_p);
        pcVar14 = (char *)(puVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar14) {
          local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
          local_3d8.field_2._8_8_ = puVar10[3];
          local_3d8._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
          local_3d8._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_3d8._M_string_length = puVar10[1];
        *puVar10 = pcVar14;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,"o + {{ACCESS}}.position","");
        std::operator+(&local_3f8,"{{ACCESS}}.indirect(",&local_270);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f8);
        pcVar14 = (char *)(puVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar14) {
          local_2d0.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
          local_2d0.field_2._8_8_ = puVar10[3];
          local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        }
        else {
          local_2d0.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
          local_2d0._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_2d0._M_string_length = puVar10[1];
        *puVar10 = pcVar14;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,
                          (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
        }
        GenConstructor(&local_310,this,&local_2d0);
        uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != paVar4) {
          uVar13 = local_3d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < (char *)(local_310._M_string_length + local_3d8._M_string_length)) {
          uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != &local_310.field_2) {
            uVar13 = local_310.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < (char *)(local_310._M_string_length + local_3d8._M_string_length))
          goto LAB_002e9614;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_310,0,(char *)0x0,(ulong)local_3d8._M_dataplus._M_p);
        }
        else {
LAB_002e9614:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_3d8,(ulong)local_310._M_dataplus._M_p);
        }
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        psVar12 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_250.field_2._M_allocated_capacity = *psVar12;
          local_250.field_2._8_8_ = puVar10[3];
        }
        else {
          local_250.field_2._M_allocated_capacity = *psVar12;
          local_250._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_250._M_string_length = puVar10[1];
        *puVar10 = psVar12;
        puVar10[1] = 0;
        *(undefined1 *)psVar12 = 0;
        CodeWriter::operator+=(local_398,&local_250);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p,
                          (ulong)(local_310.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p,
                          (ulong)(local_2d0.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != paVar4) {
          operator_delete(local_3d8._M_dataplus._M_p,
                          (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
          operator_delete(local_3b8._M_dataplus._M_p,
                          (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != paVar2) {
          operator_delete(local_330._M_dataplus._M_p,
                          (ulong)(local_330.field_2._M_allocated_capacity + 1));
        }
        uVar13 = local_370.field_2._M_allocated_capacity;
        _Var16._M_p = local_370._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p == &local_370.field_2) break;
        goto LAB_002e9782;
      }
      local_3f8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"VALUETYPE","");
      GenType_abi_cxx11_(&local_3d8,this,&type_00->type,false);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&local_398->value_map_,&local_3f8);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      paVar4 = &local_3d8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != paVar4) {
        operator_delete(local_3d8._M_dataplus._M_p,
                        (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_3f8._M_dataplus._M_p,
                        (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
      }
      local_3f8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"CONSTANT","");
      local_3d8._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"nil","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&local_398->value_map_,&local_3f8);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != paVar4) {
        operator_delete(local_3d8._M_dataplus._M_p,
                        (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_3f8._M_dataplus._M_p,
                        (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
      }
      GenReaderMainBody(&local_3b8,this,&local_390);
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      local_330._M_dataplus._M_p = (char *)0x39;
      local_370._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_370,(ulong)&local_330);
      local_370.field_2._M_allocated_capacity = (size_type)local_330._M_dataplus._M_p;
      builtin_strncpy(local_370._M_dataplus._M_p,
                      "let o = {{ACCESS}}.offset({{TABLEOFFSET}}.{{OFFSET}}.v); ",0x39);
      local_370._M_string_length = (size_type)local_330._M_dataplus._M_p;
      local_370._M_dataplus._M_p[(long)local_330._M_dataplus._M_p] = '\0';
      paVar3 = &local_3b8.field_2;
      uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != paVar3) {
        uVar13 = local_3b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_330._M_dataplus._M_p + local_3b8._M_string_length) {
        _Var16._M_p = (char *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          _Var16._M_p = local_330._M_dataplus._M_p;
        }
        if (_Var16._M_p < local_330._M_dataplus._M_p + local_3b8._M_string_length)
        goto LAB_002e73f2;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_370,0,(char *)0x0,(ulong)local_3b8._M_dataplus._M_p);
      }
      else {
LAB_002e73f2:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3b8,(ulong)local_370._M_dataplus._M_p);
      }
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_3d8.field_2._M_allocated_capacity = *psVar12;
        local_3d8.field_2._8_8_ = puVar10[3];
        local_3d8._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_3d8.field_2._M_allocated_capacity = *psVar12;
        local_3d8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3d8._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)psVar12 = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_3d8,(ulong)local_350._M_dataplus._M_p);
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_3f8.field_2._M_allocated_capacity = *psVar12;
        local_3f8.field_2._8_8_ = plVar9[3];
        local_3f8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_3f8.field_2._M_allocated_capacity = *psVar12;
        local_3f8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_3f8._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3f8);
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_1b0.field_2._M_allocated_capacity = *psVar12;
        local_1b0.field_2._8_8_ = plVar9[3];
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      }
      else {
        local_1b0.field_2._M_allocated_capacity = *psVar12;
        local_1b0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_1b0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(local_398,&local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      paVar2 = &local_3f8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != paVar4) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,
                        (ulong)(local_370.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != paVar3) {
        operator_delete(local_3b8._M_dataplus._M_p,
                        (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
      }
      local_3f8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"FIELDVAR","");
      local_3b8._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"mutable","");
      Namer::Variable(&local_3d8,&this_00->super_Namer,&local_3b8,&local_70);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&local_398->value_map_,&local_3f8);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != paVar4) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != paVar3) {
        operator_delete(local_3b8._M_dataplus._M_p,
                        (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      local_3f8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"VALUETYPE","");
      GenType_abi_cxx11_(&local_3b8,this,&type_00->type,false);
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      local_370.field_2._M_allocated_capacity = 0x656c626174754d5f;
      local_370._M_string_length = 8;
      local_370.field_2._8_8_ = local_370.field_2._8_8_ & 0xffffffffffffff00;
      uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != paVar3) {
        uVar13 = local_3b8.field_2._M_allocated_capacity;
      }
      if (((size_type *)(local_3b8._M_string_length + 8) < (size_type *)0x10) &&
         ((ulong)uVar13 < (size_type *)(local_3b8._M_string_length + 8))) {
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_370,0,(char *)0x0,(ulong)local_3b8._M_dataplus._M_p);
      }
      else {
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append((char *)&local_3b8,(ulong)&local_370.field_2);
      }
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_3d8.field_2._M_allocated_capacity = *psVar12;
        local_3d8.field_2._8_8_ = puVar10[3];
        local_3d8._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_3d8.field_2._M_allocated_capacity = *psVar12;
        local_3d8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3d8._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)psVar12 = 0;
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&local_398->value_map_,&local_3f8);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != paVar4) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != paVar3) {
        operator_delete(local_3b8._M_dataplus._M_p,
                        (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      local_3f8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"CONSTANT","");
      local_3d8._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"nil","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&local_398->value_map_,&local_3f8);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != paVar4) {
        operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
      }
      GenReaderMainBody(&local_3b8,this,&local_390);
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      local_330._M_dataplus._M_p = (pointer)0x39;
      local_370._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_370,(ulong)&local_330);
      local_370.field_2._M_allocated_capacity = (size_type)local_330._M_dataplus._M_p;
      builtin_strncpy((char *)((long)local_370._M_dataplus._M_p + 0x29),".{{OFFSE",8);
      builtin_strncpy((char *)((long)local_370._M_dataplus._M_p + 0x31),"T}}.v); ",8);
      *(undefined8 *)((long)local_370._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
      *(undefined8 *)((long)local_370._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
      *(undefined8 *)((long)local_370._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
      *(undefined8 *)((long)local_370._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
      *(undefined8 *)local_370._M_dataplus._M_p = 0x203d206f2074656c;
      *(undefined8 *)((long)local_370._M_dataplus._M_p + 8) = 0x5353454343417b7b;
      local_370._M_string_length = (size_type)local_330._M_dataplus._M_p;
      local_370._M_dataplus._M_p[(long)local_330._M_dataplus._M_p] = '\0';
      uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != paVar3) {
        uVar13 = local_3b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_330._M_dataplus._M_p + local_3b8._M_string_length) {
        _Var16._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370._M_dataplus._M_p != &local_370.field_2) {
          _Var16._M_p = local_330._M_dataplus._M_p;
        }
        if (_Var16._M_p < local_330._M_dataplus._M_p + local_3b8._M_string_length)
        goto LAB_002e9426;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_370,0,(char *)0x0,(ulong)local_3b8._M_dataplus._M_p);
      }
      else {
LAB_002e9426:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3b8,(ulong)local_370._M_dataplus._M_p);
      }
      pcVar14 = (char *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3d8.field_2._8_8_ = puVar10[3];
        local_3d8._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3d8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3d8._M_string_length = puVar10[1];
      *puVar10 = pcVar14;
      puVar10[1] = 0;
      *pcVar14 = '\0';
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_3d8,(ulong)local_350._M_dataplus._M_p);
      pcVar14 = (char *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_3f8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3f8.field_2._8_8_ = puVar10[3];
        local_3f8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_3f8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3f8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3f8._M_string_length = puVar10[1];
      *puVar10 = pcVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_310,"o + {{ACCESS}}.position","");
      GenConstructor(&local_330,this,&local_310);
      uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        uVar13 = local_3f8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < (char *)(local_330._M_string_length + local_3f8._M_string_length)) {
        uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != &local_330.field_2) {
          uVar13 = local_330.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < (char *)(local_330._M_string_length + local_3f8._M_string_length))
        goto LAB_002e98d7;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_330,0,(char *)0x0,(ulong)local_3f8._M_dataplus._M_p);
      }
      else {
LAB_002e98d7:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3f8,(ulong)local_330._M_dataplus._M_p);
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      psVar12 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_230.field_2._M_allocated_capacity = *psVar12;
        local_230.field_2._8_8_ = puVar10[3];
      }
      else {
        local_230.field_2._M_allocated_capacity = *psVar12;
        local_230._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_230._M_string_length = puVar10[1];
      *puVar10 = psVar12;
      puVar10[1] = 0;
      *(undefined1 *)psVar12 = 0;
      CodeWriter::operator+=(local_398,&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != &local_330.field_2) {
        operator_delete(local_330._M_dataplus._M_p,
                        (ulong)(local_330.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_310._M_dataplus._M_p != &local_310.field_2) {
        operator_delete(local_310._M_dataplus._M_p,
                        (ulong)(local_310.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,
                        (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != paVar4) {
        operator_delete(local_3d8._M_dataplus._M_p,
                        (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) {
        operator_delete(local_370._M_dataplus._M_p,
                        (ulong)(local_370.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != paVar3) {
        operator_delete(local_3b8._M_dataplus._M_p,
                        (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
      }
      break;
    case BASE_TYPE_UNION:
      local_3f8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"CONSTANT","");
      paVar4 = &local_3d8.field_2;
      local_3d8._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d8,"nil","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&local_398->value_map_,&local_3f8);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != paVar4) {
        operator_delete(local_3d8._M_dataplus._M_p,
                        (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != paVar2) {
        operator_delete(local_3f8._M_dataplus._M_p,
                        (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
      }
      std::operator+(&local_370,
                     "{{ACCESS_TYPE}} func {{FIELDVAR}}<T: FlatbuffersInitializable>(type: T.Type) -> T"
                     ,&local_390);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_370);
      paVar2 = &local_3b8.field_2;
      pcVar14 = (char *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_3b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3b8.field_2._8_8_ = puVar10[3];
        local_3b8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_3b8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3b8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3b8._M_string_length = puVar10[1];
      *puVar10 = pcVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      paVar3 = &local_330.field_2;
      local_310._M_dataplus._M_p = (pointer)0x39;
      local_330._M_dataplus._M_p = (pointer)paVar3;
      local_330._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_330,(ulong)&local_310);
      local_330.field_2._M_allocated_capacity = (size_type)local_310._M_dataplus._M_p;
      builtin_strncpy((char *)((long)local_330._M_dataplus._M_p + 0x29),".{{OFFSE",8);
      builtin_strncpy((char *)((long)local_330._M_dataplus._M_p + 0x31),"T}}.v); ",8);
      *(undefined8 *)((long)local_330._M_dataplus._M_p + 0x20) = 0x7d54455346464f45;
      *(undefined8 *)((long)local_330._M_dataplus._M_p + 0x28) = 0x5346464f7b7b2e7d;
      *(undefined8 *)((long)local_330._M_dataplus._M_p + 0x10) = 0x657366666f2e7d7d;
      *(undefined8 *)((long)local_330._M_dataplus._M_p + 0x18) = 0x4c4241547b7b2874;
      *(undefined8 *)local_330._M_dataplus._M_p = 0x203d206f2074656c;
      *(undefined8 *)((long)local_330._M_dataplus._M_p + 8) = 0x5353454343417b7b;
      local_330._M_string_length = (size_type)local_310._M_dataplus._M_p;
      local_330._M_dataplus._M_p[(long)local_310._M_dataplus._M_p] = '\0';
      uVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != paVar2) {
        uVar13 = local_3b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_310._M_dataplus._M_p + local_3b8._M_string_length) {
        _Var16._M_p = (pointer)(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_330._M_dataplus._M_p != paVar3) {
          _Var16._M_p = local_310._M_dataplus._M_p;
        }
        if (_Var16._M_p < local_310._M_dataplus._M_p + local_3b8._M_string_length)
        goto LAB_002e81ea;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_330,0,(char *)0x0,(ulong)local_3b8._M_dataplus._M_p);
      }
      else {
LAB_002e81ea:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_3b8,(ulong)local_330._M_dataplus._M_p);
      }
      pcVar14 = (char *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3d8.field_2._8_8_ = puVar10[3];
        local_3d8._M_dataplus._M_p = (pointer)paVar4;
      }
      else {
        local_3d8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3d8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3d8._M_string_length = puVar10[1];
      *puVar10 = pcVar14;
      puVar10[1] = 0;
      *pcVar14 = '\0';
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_3d8,(ulong)local_350._M_dataplus._M_p);
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      pcVar14 = (char *)(puVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar14) {
        local_3f8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3f8.field_2._8_8_ = puVar10[3];
      }
      else {
        local_3f8.field_2._M_allocated_capacity = *(undefined8 *)pcVar14;
        local_3f8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_3f8._M_string_length = puVar10[1];
      *puVar10 = pcVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_3f8);
      psVar12 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_210.field_2._M_allocated_capacity = *psVar12;
        local_210.field_2._8_8_ = plVar9[3];
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
      }
      else {
        local_210.field_2._M_allocated_capacity = *psVar12;
        local_210._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_210._M_string_length = plVar9[1];
      *plVar9 = (long)psVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      CodeWriter::operator+=(local_398,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,
                        (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d8._M_dataplus._M_p != paVar4) {
        operator_delete(local_3d8._M_dataplus._M_p,
                        (ulong)(local_3d8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330._M_dataplus._M_p != paVar3) {
        operator_delete(local_330._M_dataplus._M_p,
                        (ulong)(local_330.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8._M_dataplus._M_p != paVar2) {
        operator_delete(local_3b8._M_dataplus._M_p,
                        (ulong)(local_3b8.field_2._M_allocated_capacity + 1));
      }
      uVar13 = local_370.field_2._M_allocated_capacity;
      _Var16._M_p = local_370._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p != &local_370.field_2) goto LAB_002e9782;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_swift.cpp"
                    ,0x318,
                    "void flatbuffers::swift::SwiftGenerator::GenTableReaderFields(const FieldDef &)"
                   );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,
                      (ulong)(local_350.field_2._M_allocated_capacity + 1));
    }
    uVar13 = local_390.field_2._M_allocated_capacity;
    _Var16._M_p = local_390._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p == &local_390.field_2) goto LAB_002e9a76;
LAB_002e9a6e:
    operator_delete(_Var16._M_p,(ulong)(uVar13 + 1));
  }
LAB_002e9a76:
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenTableReaderFields(const FieldDef &field) {
    const auto offset = NumToString(field.value.offset);
    const auto field_field = namer_.Field(field);
    const auto type = GenType(field.value.type);
    code_.SetValue("FIELDVAR", namer_.Variable(field));
    code_.SetValue("FIELDMETHOD", namer_.Method(field));
    code_.SetValue("VALUETYPE", type);
    code_.SetValue("OFFSET", namer_.Constant(field.name));
    code_.SetValue("CONSTANT", SwiftConstant(field));
    bool opt_scalar =
        field.IsOptional() && IsScalar(field.value.type.base_type);
    std::string def_Val = opt_scalar ? "nil" : "{{CONSTANT}}";
    std::string optional = opt_scalar ? "?" : "";
    const auto const_string = "return o == 0 ? " + def_Val + " : ";
    GenComment(field.doc_comment);
    if (IsScalar(field.value.type.base_type) && !IsEnum(field.value.type) &&
        !IsBool(field.value.type.base_type)) {
      code_ += GenReaderMainBody(optional) + GenOffset() + const_string +
               GenReader("VALUETYPE", "o") + " }";
      if (parser_.opts.mutable_buffer) code_ += GenMutate("o", GenOffset());
      return;
    }

    if (IsBool(field.value.type.base_type)) {
      std::string default_value =
          field.IsOptional() ? "nil" : SwiftConstant(field);
      code_.SetValue("CONSTANT", default_value);
      code_.SetValue("VALUETYPE", "Bool");
      code_ += GenReaderMainBody(optional) + "\\";
      code_ += GenOffset() +
               "return o == 0 ? {{CONSTANT}} : " + GenReader("VALUETYPE", "o") +
               " }";
      if (parser_.opts.mutable_buffer) code_ += GenMutate("o", GenOffset());
      return;
    }

    if (IsEnum(field.value.type)) {
      const auto default_value =
          field.IsOptional() ? "nil" : GenEnumDefaultValue(field);
      code_.SetValue("BASEVALUE", GenTypeBasic(field.value.type, false));
      code_ += GenReaderMainBody(optional) + "\\";
      code_ += GenOffset() + "return o == 0 ? " + default_value + " : " +
               GenEnumConstructor("o") + "?? " + default_value + " }";
      if (parser_.opts.mutable_buffer && !IsUnion(field.value.type))
        code_ += GenMutate("o", GenOffset(), true);
      return;
    }

    const std::string is_required = field.IsRequired() ? "!" : "?";
    const auto required_reader = field.IsRequired() ? "return " : const_string;

    if (IsStruct(field.value.type) && field.value.type.struct_def->fixed) {
      code_.SetValue("VALUETYPE", GenType(field.value.type));
      code_.SetValue("CONSTANT", "nil");
      code_ += GenReaderMainBody(is_required) + GenOffset() + required_reader +
               "{{ACCESS}}.readBuffer(of: {{VALUETYPE}}.self, at: o) }";
      code_.SetValue("FIELDVAR", namer_.Variable("mutable", field_field));
      code_.SetValue("VALUETYPE", GenType(field.value.type) + Mutable());
      code_.SetValue("CONSTANT", "nil");
      code_ += GenReaderMainBody(is_required) + GenOffset() + required_reader +
               GenConstructor("o + {{ACCESS}}.position");
      return;
    }
    switch (field.value.type.base_type) {
      case BASE_TYPE_STRUCT:
        code_.SetValue("VALUETYPE", GenType(field.value.type));
        code_.SetValue("CONSTANT", "nil");
        code_ += GenReaderMainBody(is_required) + GenOffset() +
                 required_reader +
                 GenConstructor(GenIndirect("o + {{ACCESS}}.position"));
        break;

      case BASE_TYPE_STRING: {
        const auto default_string = "\"" + SwiftConstant(field) + "\"";
        code_.SetValue("VALUETYPE", GenType(field.value.type));
        code_.SetValue("CONSTANT", field.IsDefault() ? default_string : "nil");
        code_ += GenReaderMainBody(is_required) + GenOffset() +
                 required_reader + "{{ACCESS}}.string(at: o) }";
        code_ += "{{ACCESS_TYPE}} var {{FIELDVAR}}SegmentArray: [UInt8]" +
                 is_required +
                 " { return "
                 "{{ACCESS}}.getVector(at: {{TABLEOFFSET}}.{{OFFSET}}.v) }";
        break;
      }
      case BASE_TYPE_ARRAY: FLATBUFFERS_FALLTHROUGH();  // fall thru
      case BASE_TYPE_VECTOR: GenTableReaderVectorFields(field); break;
      case BASE_TYPE_UNION:
        code_.SetValue("CONSTANT", "nil");
        code_ +=
            "{{ACCESS_TYPE}} func {{FIELDVAR}}<T: "
            "FlatbuffersInitializable>(type: "
            "T.Type) -> T" +
            is_required + " { " + GenOffset() + required_reader +
            "{{ACCESS}}.union(o) }";
        break;
      default: FLATBUFFERS_ASSERT(0);
    }
  }